

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

ActionResultHolder<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_>
* testing::internal::
  ActionResultHolder<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>>
  ::
  PerformAction<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(int,pstore::gsl::span<unsigned_char,_1l>const&)>
            (Action<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
             *action,ArgumentTuple *args)

{
  ActionResultHolder<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_>
  *this;
  ArgumentTuple local_68;
  Result local_58;
  error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
  local_38;
  
  this = (ActionResultHolder<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_>
          *)operator_new(0x28);
  local_68.super__Tuple_impl<0UL,_int,_const_pstore::gsl::span<unsigned_char,__1L>_&>.
  super__Tuple_impl<1UL,_const_pstore::gsl::span<unsigned_char,__1L>_&>.
  super__Head_base<1UL,_const_pstore::gsl::span<unsigned_char,__1L>_&,_false>._M_head_impl =
       (_Head_base<1UL,_const_pstore::gsl::span<unsigned_char,__1L>_&,_false>)
       (args->super__Tuple_impl<0UL,_int,_const_pstore::gsl::span<unsigned_char,__1L>_&>).
       super__Tuple_impl<1UL,_const_pstore::gsl::span<unsigned_char,__1L>_&>.
       super__Head_base<1UL,_const_pstore::gsl::span<unsigned_char,__1L>_&,_false>._M_head_impl;
  local_68.super__Tuple_impl<0UL,_int,_const_pstore::gsl::span<unsigned_char,__1L>_&>.
  super__Head_base<0UL,_int,_false>._M_head_impl =
       (args->super__Tuple_impl<0UL,_int,_const_pstore::gsl::span<unsigned_char,__1L>_&>).
       super__Head_base<0UL,_int,_false>._M_head_impl;
  Action<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
  ::Perform(&local_58,action,&local_68);
  pstore::
  error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>
  ::error_or(&local_38,&local_58);
  ActionResultHolder<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_>
  ::ActionResultHolder(this,(Wrapper *)&local_38);
  pstore::
  error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>
  ::~error_or(&local_38);
  pstore::
  error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>
  ::~error_or(&local_58);
  return this;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }